

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall
chrono::ChSystemDescriptor::FromVectorToUnknowns
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ChVariables *pCVar7;
  double *pdVar8;
  pointer ppCVar9;
  ChConstraint *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  Index index;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  ChVectorRef local_48;
  
  iVar17 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar17;
  iVar18 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar18;
  iVar17 = this->n_q;
  if ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (long)(iVar18 + iVar17)) {
    __assert_fail("(n_q + n_c) == mvector.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x1ce,
                  "virtual int chrono::ChSystemDescriptor::FromVectorToUnknowns(const ChVectorDynamic<> &)"
                 );
  }
  ppCVar5 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar21 = (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar21 != 0) {
    lVar21 = lVar21 >> 3;
    lVar26 = 0;
    do {
      pCVar7 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar26];
      if (pCVar7->disabled == false) {
        uVar4 = pCVar7->offset;
        lVar25 = (long)(int)uVar4;
        uVar19 = (*pCVar7->_vptr_ChVariables[2])();
        pdVar8 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar19 < 0 && pdVar8 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        uVar27 = (ulong)(int)uVar19;
        if (((int)(uVar19 | uVar4) < 0) ||
           ((long)((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows - uVar27) < lVar25)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        ChVariables::Get_qb(&local_48,
                            (this->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar26]);
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != uVar27) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                       );
        }
        uVar20 = uVar27;
        if (((local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ & 7) == 0) &&
           (uVar20 = (ulong)(-((uint)((ulong)local_48.
                                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                             ._0_8_ >> 3) & 0x1fffffff) & 7),
           (long)uVar27 <= (long)uVar20)) {
          uVar20 = uVar27;
        }
        uVar23 = uVar27 - uVar20;
        uVar22 = uVar23 + 7;
        if (-1 < (long)uVar23) {
          uVar22 = uVar23;
        }
        if (0 < (long)uVar20) {
          uVar24 = 0;
          do {
            *(double *)
             (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + uVar24 * 8) = pdVar8[lVar25 + uVar24];
            uVar24 = uVar24 + 1;
          } while (uVar20 != uVar24);
        }
        uVar22 = (uVar22 & 0xfffffffffffffff8) + uVar20;
        if (7 < (long)uVar23) {
          do {
            pdVar1 = pdVar8 + lVar25 + uVar20;
            dVar3 = pdVar1[1];
            dVar11 = pdVar1[2];
            dVar12 = pdVar1[3];
            dVar13 = pdVar1[4];
            dVar14 = pdVar1[5];
            dVar15 = pdVar1[6];
            dVar16 = pdVar1[7];
            pdVar2 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar20 * 8);
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar3;
            pdVar2[2] = dVar11;
            pdVar2[3] = dVar12;
            pdVar2[4] = dVar13;
            pdVar2[5] = dVar14;
            pdVar2[6] = dVar15;
            pdVar2[7] = dVar16;
            uVar20 = uVar20 + 8;
          } while ((long)uVar20 < (long)uVar22);
        }
        if ((long)uVar22 < (long)uVar27) {
          do {
            *(double *)
             (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._0_8_ + uVar22 * 8) = pdVar8[lVar25 + uVar22];
            uVar22 = uVar22 + 1;
          } while (uVar27 != uVar22);
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != lVar21 + (ulong)(lVar21 == 0));
    iVar17 = this->n_q;
  }
  if (ppCVar6 != ppCVar5) {
    ppCVar9 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar26 = (long)ppCVar6 - (long)ppCVar5 >> 3;
    lVar21 = 0;
    pdVar8 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    do {
      pCVar10 = ppCVar9[lVar21];
      if (pCVar10->active == true) {
        lVar25 = (long)pCVar10->offset + (long)iVar17;
        if (((int)lVar25 < 0) ||
           ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= lVar25)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        auVar28._0_8_ = -pdVar8[lVar25];
        auVar28._8_4_ = 0;
        auVar28._12_4_ = 0x80000000;
        dVar3 = (double)vmovlps_avx(auVar28);
        pCVar10->l_i = dVar3;
      }
      lVar21 = lVar21 + 1;
    } while (lVar26 + (ulong)(lVar26 == 0) != lVar21);
  }
  return iVar17 + this->n_c;
}

Assistant:

int ChSystemDescriptor::FromVectorToUnknowns(const ChVectorDynamic<>& mvector) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    assert((n_q + n_c) == mvector.size());

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // Fetch from the first part of vector (x.q = q)
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->Get_qb() = mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof());
        }
    }

    // Fetch from the second part of vector (x.l = -l), with flipped sign!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(-mvector(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    return n_q + n_c;
}